

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

int __thiscall tinyusdz::AttrMetas::get_unauthoredValuesIndex(AttrMetas *this)

{
  bool bVar1;
  mapped_type *this_00;
  allocator local_31;
  int v;
  
  bVar1 = has_unauthoredValuesIndex(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)&v,"unauthoredValuesIndex",&local_31);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::at(&this->meta,(key_type *)&v);
    std::__cxx11::string::_M_dispose();
    bVar1 = MetaVariable::get_value<int>(this_00,&v);
    if (bVar1) {
      return v;
    }
  }
  return -1;
}

Assistant:

int AttrMetas::get_unauthoredValuesIndex() const {
  if (!has_unauthoredValuesIndex()) {
    return -1;
  }

  const MetaVariable &mv = meta.at("unauthoredValuesIndex");
  int v;
  if (mv.get_value<int>(&v)) {
    return v;
  }

  return -1;
}